

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O1

sat_solver * Gia_ManDeriveSatSolver(Gia_Man_t *p,Vec_Int_t *vSatIds)

{
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Ptr_t *pVVar1;
  sat_solver *psVar2;
  long lVar3;
  
  pAig = Gia_ManToAigSimple(p);
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  if (vSatIds != (Vec_Int_t *)0x0) {
    vSatIds->nSize = 0;
    pVVar1 = pAig->vCis;
    if (0 < pVVar1->nSize) {
      lVar3 = 0;
      do {
        Vec_IntPush(vSatIds,p_00->pVarNums[*(int *)((long)pVVar1->pArray[lVar3] + 0x24)]);
        lVar3 = lVar3 + 1;
        pVVar1 = pAig->vCis;
      } while (lVar3 < pVVar1->nSize);
    }
    if (vSatIds->nSize != p->vCis->nSize - p->nRegs) {
      __assert_fail("Vec_IntSize(vSatIds) == Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcChain.c"
                    ,200,"sat_solver *Gia_ManDeriveSatSolver(Gia_Man_t *, Vec_Int_t *)");
    }
  }
  Aig_ManStop(pAig);
  psVar2 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  Cnf_DataFree(p_00);
  if (p->nRegs == 0) {
    return psVar2;
  }
  __assert_fail("p->nRegs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcChain.c"
                ,0xcd,"sat_solver *Gia_ManDeriveSatSolver(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

sat_solver * Gia_ManDeriveSatSolver( Gia_Man_t * p, Vec_Int_t * vSatIds )
{
//    extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    sat_solver * pSat;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
//    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    Cnf_Dat_t * pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    // save SAT vars for the primary inputs
    if ( vSatIds )
    {
        Aig_Obj_t * pObj; int i;
        Vec_IntClear( vSatIds );
        Aig_ManForEachCi( pAig, pObj, i )
            Vec_IntPush( vSatIds, pCnf->pVarNums[ Aig_ObjId(pObj) ] );
        assert( Vec_IntSize(vSatIds) == Gia_ManPiNum(p) );
    }
    Aig_ManStop( pAig );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Cnf_DataFree( pCnf );
    assert( p->nRegs == 0 );
    return pSat;
}